

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int32_t al_fread32be(ALLEGRO_FILE *f)

{
  size_t sVar1;
  uchar b [4];
  void *in_stack_00000010;
  ALLEGRO_FILE *in_stack_00000018;
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  undefined4 local_4;
  
  sVar1 = al_fread(in_stack_00000018,in_stack_00000010,(size_t)f);
  if (sVar1 == 4) {
    local_4 = (uint)local_14 << 0x18 | (uint)local_13 << 0x10 | (uint)local_12 << 8 | (uint)local_11
    ;
  }
  else {
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

int32_t al_fread32be(ALLEGRO_FILE *f)
{
   unsigned char b[4];
   ASSERT(f);

   if (al_fread(f, b, 4) == 4) {
      return (((int32_t)b[0] << 24) | ((int32_t)b[1] << 16) |
              ((int32_t)b[2] << 8) | (int32_t)b[3]);
   }

   return EOF;
}